

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O0

TX_SIZE set_lpf_parameters(AV1_DEBLOCKING_PARAMETERS *params,ptrdiff_t mode_step,AV1_COMMON *cm,
                          MACROBLOCKD *xd,EDGE_DIR edge_dir,uint32_t x,uint32_t y,int plane,
                          macroblockd_plane *plane_ptr)

{
  BLOCK_SIZE *pBVar1;
  BLOCK_SIZE *pBVar2;
  MB_MODE_INFO *pMVar3;
  uint uVar4;
  byte bVar5;
  byte bVar6;
  BLOCK_SIZE BVar7;
  char cVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  undefined8 *puVar12;
  byte bVar13;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  char *in_RDI;
  char in_R8B;
  uint in_R9D;
  bool bVar14;
  uint in_stack_00000008;
  int in_stack_00000010;
  long in_stack_00000018;
  loop_filter_thresh *limits;
  int dim;
  int32_t pu_edge;
  int prediction_masks;
  BLOCK_SIZE bsize;
  int pv_skip_txfm;
  uint32_t pv_lvl;
  TX_SIZE pv_ts;
  int pv_col;
  int pv_row;
  MB_MODE_INFO *mi_prev;
  uint32_t level;
  int curr_skipped;
  uint32_t curr_level;
  int32_t tu_edge;
  uint32_t transform_masks;
  uint32_t coord;
  TX_SIZE ts;
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO **mi;
  int mi_col;
  int mi_row;
  uint32_t scale_vert;
  uint32_t scale_horz;
  uint32_t height;
  uint32_t width;
  TX_SIZE mb_tx_size_1;
  int blk_col_1;
  int blk_row_1;
  BLOCK_SIZE sb_type_1;
  TX_SIZE tx_size_1;
  TX_SIZE mb_tx_size;
  int blk_col;
  int blk_row;
  BLOCK_SIZE sb_type;
  TX_SIZE tx_size;
  uint local_168;
  int in_stack_fffffffffffffe9c;
  int in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  uint local_158;
  MB_MODE_INFO *in_stack_fffffffffffffeb0;
  uint in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  uint uVar15;
  undefined4 in_stack_fffffffffffffec0;
  uint uVar16;
  uint in_stack_fffffffffffffec4;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint local_e4;
  BLOCK_SIZE local_72;
  byte local_65;
  byte local_3a;
  BLOCK_SIZE local_2d;
  BLOCK_SIZE local_1;
  
  *in_RDI = '\0';
  if ((in_R9D < *(uint *)(in_stack_00000018 + 0x20)) &&
     (in_stack_00000008 < *(uint *)(in_stack_00000018 + 0x24))) {
    bVar6 = (byte)*(uint *)(in_stack_00000018 + 8);
    uVar9 = *(uint *)(in_stack_00000018 + 8) | (in_stack_00000008 << (bVar6 & 0x1f)) >> 2;
    bVar13 = (byte)*(uint *)(in_stack_00000018 + 4);
    uVar10 = *(uint *)(in_stack_00000018 + 4) | (in_R9D << (bVar13 & 0x1f)) >> 2;
    puVar12 = (undefined8 *)
              (*(long *)(in_RDX + 0x238) + (long)(int)(uVar9 * *(int *)(in_RDX + 0x244)) * 8 +
              (long)(int)uVar10 * 8);
    pBVar1 = (BLOCK_SIZE *)*puVar12;
    if (pBVar1 == (BLOCK_SIZE *)0x0) {
      local_72 = BLOCK_INVALID;
    }
    else {
      pBVar2 = (BLOCK_SIZE *)*puVar12;
      if ((in_RCX == 0) ||
         (*(int *)(in_RCX + 0x29c4 + (ulong)((byte)*(undefined2 *)(pBVar2 + 0xa7) & 7) * 4) == 0)) {
        if (in_stack_00000010 == 0) {
          local_2d = pBVar2[0x91];
          iVar11 = is_inter_block((MB_MODE_INFO *)
                                  CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          if ((iVar11 != 0) && (pBVar2[0x90] == BLOCK_4X4)) {
            BVar7 = *pBVar2;
            iVar11 = av1_get_txb_size_index
                               (BVar7,uVar9 & "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                              [BVar7] - 1,
                                uVar10 & "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                         [BVar7] - 1);
            local_2d = pBVar2[(long)iVar11 + 0x92];
          }
        }
        else {
          local_2d = av1_get_max_uv_txsize
                               ((BLOCK_SIZE)((uint)in_stack_fffffffffffffea4 >> 0x18),
                                in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
        }
        local_1 = local_2d;
      }
      else {
        local_1 = BLOCK_4X4;
      }
      if (in_R8B == '\0') {
        iVar11 = tx_size_wide[local_1];
      }
      else {
        iVar11 = tx_size_high[local_1];
        in_R9D = in_stack_00000008;
      }
      uVar18 = iVar11 - 1;
      if ((in_R9D & uVar18) == 0) {
        uVar19 = in_R9D;
        bVar5 = get_filter_level((AV1_COMMON *)CONCAT44(in_R9D,uVar18),
                                 (loop_filter_info_n *)
                                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                 in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,
                                 in_stack_fffffffffffffeb0);
        local_e4 = (uint)bVar5;
        uVar17 = in_stack_fffffffffffffec4 & 0xffffff;
        if (pBVar1[0x90] != BLOCK_4X4) {
          iVar11 = is_inter_block((MB_MODE_INFO *)
                                  CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          uVar17 = CONCAT13(iVar11 != 0,(int3)uVar17);
        }
        uVar4 = uVar17 >> 0x18;
        if (in_R9D != 0) {
          pMVar3 = (MB_MODE_INFO *)puVar12[-in_RSI];
          if (pMVar3 == (MB_MODE_INFO *)0x0) {
            return 0xff;
          }
          if (in_R8B == '\0') {
            uVar10 = uVar10 - (1 << (bVar13 & 0x1f));
          }
          else {
            uVar9 = uVar9 - (1 << (bVar6 & 0x1f));
          }
          uVar15 = uVar10;
          uVar16 = uVar9;
          if ((in_RCX == 0) ||
             (*(int *)(in_RCX + 0x29c4 + (ulong)((byte)*(undefined2 *)&pMVar3->field_0xa7 & 7) * 4)
              == 0)) {
            if (in_stack_00000010 == 0) {
              local_65 = pMVar3->tx_size;
            }
            else {
              local_65 = av1_get_max_uv_txsize
                                   ((BLOCK_SIZE)((uint)in_stack_fffffffffffffea4 >> 0x18),
                                    in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
            }
            in_stack_fffffffffffffeb8 = (uint)local_65;
            if (((in_stack_00000010 == 0) &&
                (iVar11 = is_inter_block((MB_MODE_INFO *)
                                         CONCAT44(in_stack_fffffffffffffea4,
                                                  in_stack_fffffffffffffea0)), iVar11 != 0)) &&
               (pMVar3->skip_txfm == '\0')) {
              BVar7 = pMVar3->bsize;
              in_stack_fffffffffffffeb0 = pMVar3;
              iVar11 = av1_get_txb_size_index
                                 (BVar7,uVar9 & "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                                [BVar7] - 1,
                                  uVar10 & "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                           [BVar7] - 1);
              local_65 = in_stack_fffffffffffffeb0->inter_tx_size[iVar11];
            }
            local_3a = local_65;
          }
          else {
            local_3a = 0;
          }
          bVar6 = get_filter_level((AV1_COMMON *)CONCAT44(uVar19,uVar18),
                                   (loop_filter_info_n *)CONCAT44(uVar17,uVar16),uVar15,
                                   in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
          local_168 = (uint)bVar6;
          bVar14 = false;
          if (pMVar3->skip_txfm != '\0') {
            iVar11 = is_inter_block((MB_MODE_INFO *)
                                    CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
            bVar14 = iVar11 != 0;
          }
          BVar7 = get_plane_block_size
                            (*pBVar1,*(int *)(in_stack_00000018 + 4),*(int *)(in_stack_00000018 + 8)
                            );
          if (in_R8B == '\0') {
            bVar6 = block_size_wide[BVar7];
          }
          else {
            bVar6 = block_size_high[BVar7];
          }
          local_158 = bVar6 - 1;
          if (((local_e4 != 0) || (local_168 != 0)) &&
             ((!bVar14 || ((uVar4 == 0 || ((in_R9D & local_158) == 0)))))) {
            if (in_R8B == '\0') {
              if (tx_size_wide_unit_log2[local_1] < tx_size_wide_unit_log2[local_3a]) {
                iVar11 = tx_size_wide_unit_log2[local_1];
              }
              else {
                iVar11 = tx_size_wide_unit_log2[local_3a];
              }
            }
            else if (tx_size_high_unit_log2[local_1] < tx_size_high_unit_log2[local_3a]) {
              iVar11 = tx_size_high_unit_log2[local_1];
            }
            else {
              iVar11 = tx_size_high_unit_log2[local_3a];
            }
            if (in_stack_00000010 == 0) {
              *in_RDI = (char)tx_dim_to_filter_length[iVar11];
            }
            else {
              cVar8 = '\x06';
              if (iVar11 == 0) {
                cVar8 = '\x04';
              }
              *in_RDI = cVar8;
            }
            if (local_e4 != 0) {
              local_168 = local_e4;
            }
            local_e4 = local_168;
          }
        }
        if (*in_RDI != '\0') {
          *(ulong *)(in_RDI + 8) = in_RDX + 0x4af0 + (ulong)local_e4 * 0x30;
        }
        local_72 = local_1;
      }
      else {
        local_72 = local_1;
      }
    }
  }
  else {
    local_72 = BLOCK_4X4;
  }
  return local_72;
}

Assistant:

static TX_SIZE set_lpf_parameters(
    AV1_DEBLOCKING_PARAMETERS *const params, const ptrdiff_t mode_step,
    const AV1_COMMON *const cm, const MACROBLOCKD *const xd,
    const EDGE_DIR edge_dir, const uint32_t x, const uint32_t y,
    const int plane, const struct macroblockd_plane *const plane_ptr) {
  // reset to initial values
  params->filter_length = 0;

  // no deblocking is required
  const uint32_t width = plane_ptr->dst.width;
  const uint32_t height = plane_ptr->dst.height;
  if ((width <= x) || (height <= y)) {
    // just return the smallest transform unit size
    return TX_4X4;
  }

  const uint32_t scale_horz = plane_ptr->subsampling_x;
  const uint32_t scale_vert = plane_ptr->subsampling_y;
  // for sub8x8 block, chroma prediction mode is obtained from the bottom/right
  // mi structure of the co-located 8x8 luma block. so for chroma plane, mi_row
  // and mi_col should map to the bottom/right mi structure, i.e, both mi_row
  // and mi_col should be odd number for chroma plane.
  const int mi_row = scale_vert | ((y << scale_vert) >> MI_SIZE_LOG2);
  const int mi_col = scale_horz | ((x << scale_horz) >> MI_SIZE_LOG2);
  MB_MODE_INFO **mi =
      cm->mi_params.mi_grid_base + mi_row * cm->mi_params.mi_stride + mi_col;
  const MB_MODE_INFO *mbmi = mi[0];
  // If current mbmi is not correctly setup, return an invalid value to stop
  // filtering. One example is that if this tile is not coded, then its mbmi
  // it not set up.
  if (mbmi == NULL) return TX_INVALID;

  const TX_SIZE ts = get_transform_size(xd, mi[0], mi_row, mi_col, plane,
                                        scale_horz, scale_vert);

  {
    const uint32_t coord = (VERT_EDGE == edge_dir) ? (x) : (y);
    const uint32_t transform_masks =
        edge_dir == VERT_EDGE ? tx_size_wide[ts] - 1 : tx_size_high[ts] - 1;
    const int32_t tu_edge = (coord & transform_masks) ? (0) : (1);

    if (!tu_edge) return ts;

    // prepare outer edge parameters. deblock the edge if it's an edge of a TU
    {
      const uint32_t curr_level =
          get_filter_level(cm, &cm->lf_info, edge_dir, plane, mbmi);
      const int curr_skipped = mbmi->skip_txfm && is_inter_block(mbmi);
      uint32_t level = curr_level;
      if (coord) {
        {
          const MB_MODE_INFO *const mi_prev = *(mi - mode_step);
          if (mi_prev == NULL) return TX_INVALID;
          const int pv_row =
              (VERT_EDGE == edge_dir) ? (mi_row) : (mi_row - (1 << scale_vert));
          const int pv_col =
              (VERT_EDGE == edge_dir) ? (mi_col - (1 << scale_horz)) : (mi_col);
          const TX_SIZE pv_ts = get_transform_size(
              xd, mi_prev, pv_row, pv_col, plane, scale_horz, scale_vert);

          const uint32_t pv_lvl =
              get_filter_level(cm, &cm->lf_info, edge_dir, plane, mi_prev);

          const int pv_skip_txfm =
              mi_prev->skip_txfm && is_inter_block(mi_prev);
          const BLOCK_SIZE bsize = get_plane_block_size(
              mbmi->bsize, plane_ptr->subsampling_x, plane_ptr->subsampling_y);
          assert(bsize < BLOCK_SIZES_ALL);
          const int prediction_masks = edge_dir == VERT_EDGE
                                           ? block_size_wide[bsize] - 1
                                           : block_size_high[bsize] - 1;
          const int32_t pu_edge = !(coord & prediction_masks);
          // if the current and the previous blocks are skipped,
          // deblock the edge if the edge belongs to a PU's edge only.
          if ((curr_level || pv_lvl) &&
              (!pv_skip_txfm || !curr_skipped || pu_edge)) {
            const int dim = (VERT_EDGE == edge_dir)
                                ? AOMMIN(tx_size_wide_unit_log2[ts],
                                         tx_size_wide_unit_log2[pv_ts])
                                : AOMMIN(tx_size_high_unit_log2[ts],
                                         tx_size_high_unit_log2[pv_ts]);
            if (plane) {
              params->filter_length = (dim == 0) ? 4 : 6;
            } else {
              assert(dim < TX_SIZES);
              assert(dim >= 0);
              params->filter_length = tx_dim_to_filter_length[dim];
            }

            // update the level if the current block is skipped,
            // but the previous one is not
            level = (curr_level) ? (curr_level) : (pv_lvl);
          }
        }
      }
      // prepare common parameters
      if (params->filter_length) {
        const loop_filter_thresh *const limits = cm->lf_info.lfthr + level;
        params->lfthr = limits;
      }
    }
  }

  return ts;
}